

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.h
# Opt level: O0

String * __thiscall
kj::str<long,char_const(&)[3]>
          (String *__return_storage_ptr__,kj *this,long *params,char (*params_1) [3])

{
  long *value;
  char (*value_00) [3];
  ArrayPtr<const_char> local_58;
  CappedArray<char,_26UL> local_48;
  char (*local_20) [3];
  char (*params_local_1) [3];
  long *params_local;
  
  local_20 = (char (*) [3])params;
  params_local_1 = (char (*) [3])this;
  params_local = (long *)__return_storage_ptr__;
  value = fwd<long>((NoInfer<long> *)this);
  toCharSequence<long>(&local_48,value);
  value_00 = ::const(local_20);
  local_58 = toCharSequence<char_const(&)[3]>(value_00);
  _::concat<kj::CappedArray<char,26ul>,kj::ArrayPtr<char_const>>
            (__return_storage_ptr__,(_ *)&local_48,(CappedArray<char,_26UL> *)&local_58,
             (ArrayPtr<const_char> *)params_1);
  return __return_storage_ptr__;
}

Assistant:

String str(Params&&... params) {
  // Magic function which builds a string from a bunch of arbitrary values.  Example:
  //     str(1, " / ", 2, " = ", 0.5)
  // returns:
  //     "1 / 2 = 0.5"
  // To teach `str` how to stringify a type, see `Stringifier`.

  return _::concat(toCharSequence(kj::fwd<Params>(params))...);
}